

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O1

char * __thiscall Fl_GTK_File_Chooser::filename(Fl_GTK_File_Chooser *this,int i)

{
  gboolean gVar1;
  char *pcVar2;
  
  gVar1 = (*fl_gtk_file_chooser_get_select_multiple)((GtkFileChooser *)this->gtkw_ptr);
  if (gVar1 == 0) {
    pcVar2 = this->gtkw_filename;
  }
  else {
    if ((uint)i < this->gtkw_count) {
      pcVar2 = (char *)(*fl_g_slist_nth_data)((GSList *)this->gtkw_slist,i);
      return pcVar2;
    }
    pcVar2 = "";
  }
  return pcVar2;
}

Assistant:

const char *Fl_GTK_File_Chooser::filename(int i) const
{
  if(fl_gtk_file_chooser_get_select_multiple((GtkFileChooser *)gtkw_ptr) == FALSE) {
    return gtkw_filename;
  }
  else {
    if ((unsigned)i < gtkw_count) {
      GSList *iter = (GSList *)gtkw_slist;
      char *nm = (char *)fl_g_slist_nth_data(iter, i);
      return nm;
    }
  }
  return("");
}